

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_command * nk__begin(nk_context *ctx)

{
  undefined4 uVar1;
  nk_vec2 nVar2;
  undefined4 uVar3;
  void *pvVar4;
  nk_cursor *img;
  void *pvVar5;
  nk_size nVar6;
  long lVar7;
  nk_window *pnVar8;
  nk_window *pnVar9;
  nk_window *pnVar10;
  nk_rect r;
  
  if (ctx == (nk_context *)0x0) {
    return (nk_command *)0x0;
  }
  if (ctx->count != 0) {
    pvVar4 = (ctx->memory).memory.ptr;
    if (ctx->build == 0) {
      if ((ctx->style).cursor_active == (nk_cursor *)0x0) {
        (ctx->style).cursor_active = (ctx->style).cursors[0];
      }
      img = (ctx->style).cursor_active;
      if (((img != (nk_cursor *)0x0) && ((ctx->input).mouse.grabbed == '\0')) &&
         ((ctx->style).cursor_visible != 0)) {
        (ctx->overlay).base = &ctx->memory;
        (ctx->overlay).use_clipping = 0;
        nVar6 = (ctx->memory).allocated;
        (ctx->overlay).begin = nVar6;
        (ctx->overlay).end = nVar6;
        (ctx->overlay).last = nVar6;
        (ctx->overlay).clip = nk_null_rect;
        nVar2 = (ctx->input).mouse.pos;
        uVar1 = (img->size).x;
        uVar3 = (img->size).y;
        r.h = (float)uVar3;
        r.w = (float)uVar1;
        r.x = nVar2.x - (img->offset).x;
        r.y = nVar2.y - (img->offset).y;
        nk_draw_image(&ctx->overlay,r,&img->img,(nk_color)0xffffffff);
        (ctx->overlay).end = (ctx->memory).allocated;
      }
      pnVar8 = ctx->begin;
      pvVar5 = (ctx->memory).memory.ptr;
      if (pnVar8 == (nk_window *)0x0) {
        lVar7 = 0;
      }
      else {
        lVar7 = 0;
        pnVar10 = pnVar8;
        do {
          nVar6 = (pnVar10->buffer).last;
          pnVar9 = pnVar10->next;
          if (((nVar6 != (pnVar10->buffer).begin) && ((pnVar10->flags & 0x2000) == 0)) &&
             (pnVar10->seq == ctx->seq)) {
            lVar7 = nVar6 + (long)pvVar5;
            for (; pnVar9 != (nk_window *)0x0; pnVar9 = pnVar9->next) {
              nVar6 = (pnVar9->buffer).begin;
              if ((((pnVar9->buffer).last != nVar6) && ((pnVar9->flags & 0x2000) == 0)) &&
                 (pnVar9->seq == ctx->seq)) {
                *(nk_size *)(lVar7 + 8) = nVar6;
                goto LAB_0010da86;
              }
            }
            pnVar9 = (nk_window *)0x0;
          }
LAB_0010da86:
          pnVar10 = pnVar9;
        } while (pnVar9 != (nk_window *)0x0);
      }
      while (pnVar10 = pnVar8, pnVar10 != (nk_window *)0x0) {
        pnVar8 = pnVar10->next;
        if ((pnVar10->popup).buf.active != 0) {
          *(nk_size *)(lVar7 + 8) = (pnVar10->popup).buf.begin;
          lVar7 = (pnVar10->popup).buf.last + (long)pvVar5;
          (pnVar10->popup).buf.active = 0;
        }
      }
      if (lVar7 != 0) {
        nVar6 = (ctx->overlay).begin;
        if ((ctx->overlay).end == nVar6) {
          nVar6 = (ctx->memory).allocated;
        }
        *(nk_size *)(lVar7 + 8) = nVar6;
      }
      ctx->build = 1;
    }
    pnVar8 = ctx->begin;
    if (pnVar8 != (nk_window *)0x0) {
      while (((nVar6 = (pnVar8->buffer).begin, nVar6 == (pnVar8->buffer).end ||
              ((pnVar8->flags & 0x2000) != 0)) || (pnVar8->seq != ctx->seq))) {
        pnVar8 = pnVar8->next;
        if (pnVar8 == (nk_window *)0x0) {
          return (nk_command *)0x0;
        }
      }
      return (nk_command *)((long)pvVar4 + nVar6);
    }
  }
  return (nk_command *)0x0;
}

Assistant:

NK_API const struct nk_command*
nk__begin(struct nk_context *ctx)
{
struct nk_window *iter;
nk_byte *buffer;
NK_ASSERT(ctx);
if (!ctx) return 0;
if (!ctx->count) return 0;

buffer = (nk_byte*)ctx->memory.memory.ptr;
if (!ctx->build) {
nk_build(ctx);
ctx->build = nk_true;
}
iter = ctx->begin;
while (iter && ((iter->buffer.begin == iter->buffer.end) ||
(iter->flags & NK_WINDOW_HIDDEN) || iter->seq != ctx->seq))
iter = iter->next;
if (!iter) return 0;
return nk_ptr_add_const(struct nk_command, buffer, iter->buffer.begin);
}